

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_NumericAlign_Test::TestBody(FormatterTest_NumericAlign_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_18;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_17;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_16;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_15;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  undefined7 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70f;
  char *in_stack_fffffffffffff710;
  string *actual_expression;
  char *in_stack_fffffffffffff718;
  int line;
  char *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  Type in_stack_fffffffffffff72c;
  AssertionResult *in_stack_fffffffffffff730;
  char (*in_stack_fffffffffffff738) [9];
  Message *in_stack_fffffffffffff778;
  AssertHelper *in_stack_fffffffffffff780;
  string local_640 [32];
  AssertionResult local_620 [3];
  undefined8 local_5f0;
  string local_5e8 [38];
  byte local_5c2;
  allocator local_5c1;
  string local_5c0 [32];
  AssertionResult local_5a0 [3];
  string local_570 [38];
  byte local_54a;
  allocator local_549;
  string local_548 [32];
  AssertionResult local_528 [3];
  undefined1 local_4f1;
  string local_4f0 [38];
  byte local_4ca;
  allocator local_4c9;
  string local_4c8 [32];
  AssertionResult local_4a8 [3];
  int local_478;
  undefined1 local_471;
  string local_470 [38];
  byte local_44a;
  allocator local_449;
  string local_448 [32];
  AssertionResult local_428 [2];
  longdouble local_408;
  string local_3f0 [32];
  AssertionResult local_3d0 [2];
  undefined8 local_3b0;
  string local_3a8 [32];
  AssertionResult local_388 [2];
  undefined8 local_368;
  string local_360 [32];
  AssertionResult local_340 [2];
  undefined8 local_320;
  string local_318 [32];
  AssertionResult local_2f8 [2];
  undefined8 local_2d8;
  string local_2d0 [32];
  AssertionResult local_2b0 [2];
  undefined8 local_290;
  string local_288 [32];
  AssertionResult local_268 [2];
  undefined4 local_244;
  string local_240 [32];
  AssertionResult local_220 [2];
  undefined4 local_1fc;
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  undefined4 local_1b4;
  string local_1b0 [32];
  AssertionResult local_190 [2];
  undefined4 local_16c;
  string local_168 [32];
  AssertionResult local_148 [2];
  undefined4 local_124;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  local_3c = 0x2a;
  fmt::v5::format<char[7],int>
            ((char (*) [7])in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13932a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13938d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1393e5);
  local_94 = 0x2a;
  fmt::v5::format<char[8],int>
            ((char (*) [8])in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x1394e2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x139545);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13959d);
  local_dc = 0x22;
  fmt::v5::format<char[8],int>
            ((char (*) [8])in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13969a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x1396fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139755);
  local_124 = 0x22;
  fmt::v5::format<char[9],int>(in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x139852);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x1398b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13990d);
  local_16c = 0x42;
  fmt::v5::format<char[8],int>
            ((char (*) [8])in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x139a0a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x139a6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139ac5);
  local_1b4 = 0x42;
  fmt::v5::format<char[9],int>(in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x139bc2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x139c25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139c7d);
  local_1fc = 0xffffffd6;
  fmt::v5::format<char[7],int>
            ((char (*) [7])in_stack_fffffffffffff738,(int *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x139d7a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x139ddd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139e35);
  local_244 = 0x2a;
  fmt::v5::format<char[7],unsigned_int>
            ((char (*) [7])in_stack_fffffffffffff738,(uint *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x139f32);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x139f95);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139fed);
  local_290 = 0xffffffffffffffd6;
  fmt::v5::format<char[7],long>
            ((char (*) [7])in_stack_fffffffffffff738,(long *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a0eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13a14e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a1a6);
  local_2d8 = 0x2a;
  fmt::v5::format<char[7],unsigned_long>
            ((char (*) [7])in_stack_fffffffffffff738,(unsigned_long *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a2a4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13a307);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a35f);
  local_320 = 0xffffffffffffffd6;
  fmt::v5::format<char[7],long_long>
            ((char (*) [7])in_stack_fffffffffffff738,(longlong *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a45d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13a4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a518);
  local_368 = 0x2a;
  fmt::v5::format<char[7],unsigned_long_long>
            ((char (*) [7])in_stack_fffffffffffff738,(unsigned_long_long *)in_stack_fffffffffffff730
            );
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a616);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13a679);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a6d1);
  local_3b0 = 0xc045000000000000;
  fmt::v5::format<char[7],double>
            ((char (*) [7])in_stack_fffffffffffff738,(double *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a7d5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13a838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a890);
  local_408 = (longdouble)-42.0;
  fmt::v5::format<char[7],long_double>
            ((char (*) [7])in_stack_fffffffffffff738,(longdouble *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13a98f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13a9f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13aa4a);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"missing \'}\' in format string",&local_449);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    local_44a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_471 = 99;
      fmt::v5::format<char[6],char>
                ((char (*) [6])in_stack_fffffffffffff738,&in_stack_fffffffffffff730->success_);
      std::__cxx11::string::~string(local_470);
    }
    if ((local_44a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff730,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      local_478 = 2;
    }
    else {
      local_478 = 0;
    }
    std::__cxx11::string::~string(local_448);
    if (local_478 != 0) goto LAB_0013aded;
  }
  else {
LAB_0013aded:
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13ae09);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13ae6c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13aec4);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"invalid format specifier for char",&local_4c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    local_4ca = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_4f1 = 99;
      fmt::v5::format<char[7],char>
                ((char (*) [7])in_stack_fffffffffffff738,&in_stack_fffffffffffff730->success_);
      std::__cxx11::string::~string(local_4f0);
    }
    if ((local_4ca & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff730,
                 (char (*) [103])CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      local_478 = 3;
    }
    else {
      local_478 = 0;
    }
    std::__cxx11::string::~string(local_4c8);
    if (local_478 != 0) goto LAB_0013b267;
  }
  else {
LAB_0013b267:
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b283);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13b2e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b33e);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_548,"format specifier requires numeric argument",&local_549);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    local_54a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],char[4]>
                ((char (*) [7])in_stack_fffffffffffff738,&in_stack_fffffffffffff730->success_);
      std::__cxx11::string::~string(local_570);
    }
    if ((local_54a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff730,
                 (char (*) [105])CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      local_478 = 4;
    }
    else {
      local_478 = 0;
    }
    std::__cxx11::string::~string(local_548);
    if (local_478 != 0) goto LAB_0013b6d2;
  }
  else {
LAB_0013b6d2:
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    testing::AssertionResult::failure_message((AssertionResult *)0x13b6ee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
               in_stack_fffffffffffff710);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
    testing::Message::~Message((Message *)0x13b74b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b7a3);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"format specifier requires numeric argument",&local_5c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    local_5c2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_5f0 = 0xface;
      fmt::v5::format<char[7],void*>
                ((char (*) [7])in_stack_fffffffffffff738,(void **)in_stack_fffffffffffff730);
      std::__cxx11::string::~string(local_5e8);
    }
    if ((local_5c2 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff730,
                 (char (*) [131])CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      local_478 = 5;
    }
    else {
      local_478 = 0;
    }
    std::__cxx11::string::~string(local_5c0);
    if (local_478 == 0) goto LAB_0013bbd2;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff730);
  in_stack_fffffffffffff718 = testing::AssertionResult::failure_message((AssertionResult *)0x13bb2a)
  ;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
             in_stack_fffffffffffff720,(int)((ulong)in_stack_fffffffffffff718 >> 0x20),
             in_stack_fffffffffffff710);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff700);
  testing::Message::~Message((Message *)0x13bb87);
LAB_0013bbd2:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bbdf);
  actual_expression = local_640;
  fmt::v5::format<char[6],double>
            ((char (*) [6])in_stack_fffffffffffff738,(double *)in_stack_fffffffffffff730);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff718,(char *)actual_expression,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             in_stack_fffffffffffff700);
  line = (int)((ulong)in_stack_fffffffffffff718 >> 0x20);
  std::__cxx11::string::~string(local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_620);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff730);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13bcd7)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
               in_stack_fffffffffffff720,line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13bd34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bd89);
  return;
}

Assistant:

TEST(FormatterTest, NumericAlign) {
  EXPECT_EQ("  42", format("{0:=4}", 42));
  EXPECT_EQ("+ 42", format("{0:=+4}", 42));
  EXPECT_EQ("  42", format("{0:=4o}", 042));
  EXPECT_EQ("+ 42", format("{0:=+4o}", 042));
  EXPECT_EQ("  42", format("{0:=4x}", 0x42));
  EXPECT_EQ("+ 42", format("{0:=+4x}", 0x42));
  EXPECT_EQ("-  42", format("{0:=5}", -42));
  EXPECT_EQ("   42", format("{0:=5}", 42u));
  EXPECT_EQ("-  42", format("{0:=5}", -42l));
  EXPECT_EQ("   42", format("{0:=5}", 42ul));
  EXPECT_EQ("-  42", format("{0:=5}", -42ll));
  EXPECT_EQ("   42", format("{0:=5}", 42ull));
  EXPECT_EQ("-  42", format("{0:=5}", -42.0));
  EXPECT_EQ("-  42", format("{0:=5}", -42.0l));
  EXPECT_THROW_MSG(format("{0:=5", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:=5}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:=5}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:=8}", reinterpret_cast<void*>(0xface)),
      format_error, "format specifier requires numeric argument");
  EXPECT_EQ(" 1", fmt::format("{:= }", 1.0));
}